

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O1

string * __thiscall
mnf::CartesianProduct::description
          (string *__return_storage_ptr__,CartesianProduct *this,string *prefix,bool firstCall)

{
  pointer pcVar1;
  long *plVar2;
  char cVar3;
  ostream *poVar4;
  pointer psVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream ss;
  char *local_208;
  long local_200;
  char local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  string *local_1c8;
  ulong local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((int)CONCAT71(in_register_00000009,firstCall) == 0) {
    psVar5 = (this->subManifolds_).
             super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->subManifolds_).
        super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        cVar3 = (**(code **)(**(long **)((long)&(psVar5->
                                                super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar7) + 0x20))();
        if (cVar3 == '\0') {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"/cartprod--------------------------",0x23);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          plVar2 = *(long **)((long)&(((this->subManifolds_).
                                       super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar7);
          local_1e8[0] = local_1d8;
          pcVar1 = (prefix->_M_dataplus)._M_p;
          local_1c0 = uVar6;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1e8,pcVar1,pcVar1 + prefix->_M_string_length);
          std::__cxx11::string::append((char *)local_1e8);
          (**(code **)(*plVar2 + 0x28))(&local_208,plVar2,(string *)local_1e8,0);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_208,local_200);
          if (local_208 != local_1f8) {
            operator_delete(local_208);
          }
          if (local_1e8[0] != local_1d8) {
            operator_delete(local_1e8[0]);
          }
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
          uVar6 = local_1c0;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"\\----------------------------------",0x23);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        else {
          plVar2 = *(long **)((long)&(((this->subManifolds_).
                                       super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar7);
          (**(code **)(*plVar2 + 0x28))(&local_208,plVar2,prefix,1);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_208,local_200);
          if (local_208 != local_1f8) {
            operator_delete(local_208);
          }
        }
        uVar6 = uVar6 + 1;
        psVar5 = (this->subManifolds_).
                 super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 0x10;
      } while (uVar6 < (ulong)((long)(this->subManifolds_).
                                     super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4)
              );
    }
  }
  else {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"/cartprod--------------------------",0x23);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pcVar1 = (prefix->_M_dataplus)._M_p;
    local_1e8[0] = local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e8,pcVar1,pcVar1 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)local_1e8);
    (*(this->super_Manifold)._vptr_Manifold[5])(&local_208,this,local_1e8,0);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_208,local_200);
    if (local_208 != local_1f8) {
      operator_delete(local_208);
    }
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0]);
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\\----------------------------------",0x23);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_1c8;
}

Assistant:

std::string CartesianProduct::description(const std::string& prefix,
                                          bool firstCall) const
{
  std::stringstream ss;
  if (firstCall)
  {
    ss << prefix << "/cartprod--------------------------" << std::endl;
    ss << this->description(prefix + "| ", false);
    ss << prefix << "\\----------------------------------" << std::endl;
  }
  else
  {
    for (size_t i = 0; i < subManifolds_.size(); ++i)
    {
      if (subManifolds_[i]->isElementary())
      {
        ss << subManifolds_[i]->description(prefix);
      }
      else
      {
        ss << prefix << "/cartprod--------------------------" << std::endl;
        ss << subManifolds_[i]->description(prefix + "| ", false);
        ss << prefix << "\\----------------------------------" << std::endl;
      }
    }
  }
  return ss.str();
}